

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O0

void strings(void)

{
  rtosc_cmp_options *unaff_retaddr;
  size_t in_stack_00000008;
  size_t in_stack_00000010;
  rtosc_arg_val_t *in_stack_00000018;
  rtosc_arg_val_t *in_stack_00000020;
  char *in_stack_00000030;
  int in_stack_00000038;
  char *in_stack_fffffffffffffff8;
  
  l[1].type = 's';
  l[0].type = 's';
  l[0].val.d = anon_var_dwarf_4de;
  l[1].val.d = (long)"rtosc rtosc rtosc" + 0xc;
  r[0].val.d = anon_var_dwarf_4fe;
  r[1].val.d = (long)"#\n" + 2;
  cmp_gt(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
         in_stack_fffffffffffffff8,in_stack_00000030,in_stack_00000038);
  cmp_gt(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
         in_stack_fffffffffffffff8,in_stack_00000030,in_stack_00000038);
  cmp_gt(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
         in_stack_fffffffffffffff8,in_stack_00000030,in_stack_00000038);
  return;
}

Assistant:

void strings()
{
    l[0].type = l[1].type = 's';

    l[0].val.s = "rtosc rtosc rtosc";
    l[1].val.s = "rtosc";
    r[0].val.s = "rt0sc";
    r[1].val.s = "";

    cmp_gt(l, r, 1, 1, NULL, "one string", "another string", __LINE__);
    cmp_gt(l, l+1, 1, 1, NULL, "one string", "subset string", __LINE__);
    cmp_gt(r, r+1, 1, 1, NULL, "normal string", "empty string", __LINE__);
}